

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O0

void __thiscall FParser::OPcmp(FParser *this,svalue_t *result,int start,int n,int stop)

{
  int iVar1;
  fsfix fVar2;
  fsfix fVar3;
  int iVar4;
  char *__s1;
  char *__s2;
  undefined1 local_58 [8];
  svalue_t right;
  svalue_t left;
  int stop_local;
  int n_local;
  int start_local;
  svalue_t *result_local;
  FParser *this_local;
  
  left.value._4_4_ = stop;
  svalue_t::svalue_t((svalue_t *)&right.value);
  svalue_t::svalue_t((svalue_t *)local_58);
  EvaluateExpression(this,(svalue_t *)&right.value,start,n + -1);
  EvaluateExpression(this,(svalue_t *)local_58,n + 1,left.value._4_4_);
  result->type = 1;
  if ((right.value.i == 0) && (local_58._0_4_ == 0)) {
    __s1 = FString::operator_cast_to_char_((FString *)&left);
    __s2 = FString::operator_cast_to_char_((FString *)&right);
    iVar1 = strcmp(__s1,__s2);
    *(uint *)&result->value = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  }
  else if ((right.value.i == 2) && (local_58._0_4_ == 2)) {
    *(uint *)&result->value = (uint)(left.string.Chars == right.string.Chars);
  }
  else if ((right.value.i == 6) || (local_58._0_4_ == 6)) {
    fVar2 = fixedvalue((svalue_t *)&right.value);
    fVar3 = fixedvalue((svalue_t *)local_58);
    *(uint *)&result->value = (uint)(fVar2 == fVar3);
  }
  else {
    iVar1 = intvalue((svalue_t *)&right.value);
    iVar4 = intvalue((svalue_t *)local_58);
    *(uint *)&result->value = (uint)(iVar1 == iVar4);
  }
  svalue_t::~svalue_t((svalue_t *)local_58);
  svalue_t::~svalue_t((svalue_t *)&right.value);
  return;
}

Assistant:

void FParser::OPcmp(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	
	evaluate_leftnright(start, n, stop);
	
	result.type = svt_int;        // always an int returned
	
	if(left.type == svt_string && right.type == svt_string)
	{
		result.value.i = !strcmp(left.string, right.string);
		return;
	}
	
	// haleyjd: direct mobj comparison when both are mobj
	if(left.type == svt_mobj && right.type == svt_mobj)
	{
		// we can safely assume reference equivalency for
		// AActor's in all cases since they are static for the
		// duration of a level
		result.value.i = (left.value.mobj == right.value.mobj);
		return;
	}
	
	if(left.type == svt_fixed || right.type == svt_fixed)
	{
		result.value.i = (fixedvalue(left) == fixedvalue(right));
		return;
	}
	
	result.value.i = (intvalue(left) == intvalue(right));
}